

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O1

boolean encode_mcu_AC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  short sVar1;
  int iVar2;
  jpeg_entropy_encoder *pjVar3;
  JBLOCKROW paJVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  _func_void_j_compress_ptr *p_Var16;
  
  pjVar3 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)&pjVar3[4].start_pass == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar3[4].start_pass + 4));
      *(uint *)&pjVar3[4].start_pass = cinfo->restart_interval;
      *(uint *)((long)&pjVar3[4].start_pass + 4) =
           *(int *)((long)&pjVar3[4].start_pass + 4) + 1U & 7;
    }
    *(int *)&pjVar3[4].start_pass = *(int *)&pjVar3[4].start_pass + -1;
  }
  paJVar4 = *MCU_data;
  lVar9 = (long)cinfo->Se;
  if (0 < lVar9) {
    do {
      sVar1 = (*paJVar4)[jpeg_natural_order[lVar9]];
      uVar8 = (uint)sVar1;
      if (sVar1 < 0) {
        uVar8 = -uVar8;
      }
      if (uVar8 >> ((byte)cinfo->Al & 0x1f) != 0) goto LAB_0013594b;
      bVar5 = 1 < lVar9;
      lVar9 = lVar9 + -1;
    } while (bVar5);
    lVar9 = 0;
  }
LAB_0013594b:
  iVar2 = cinfo->cur_comp_info[0]->ac_tbl_no;
  iVar15 = cinfo->Ss;
  if (iVar15 <= (int)lVar9) {
LAB_0013597f:
    p_Var16 = (&pjVar3[9].finish_pass)[iVar2];
    lVar11 = (long)(iVar15 * 3 + -3);
    arith_encode(cinfo,(uchar *)(p_Var16 + lVar11),0);
    piVar12 = jpeg_natural_order + iVar15;
    p_Var16 = p_Var16 + lVar11 + 2;
    iVar10 = iVar15;
    do {
      sVar1 = (*paJVar4)[*piVar12];
      uVar8 = (uint)sVar1;
      if (sVar1 < 0) {
        bVar6 = (byte)cinfo->Al & 0x1f;
        uVar13 = -uVar8 >> bVar6;
        if (-uVar8 >> bVar6 != 0) {
          arith_encode(cinfo,(uchar *)(p_Var16 + -1),1);
          iVar15 = 1;
          goto LAB_00135a42;
        }
      }
      else {
        bVar6 = (byte)cinfo->Al & 0x1f;
        uVar13 = uVar8 >> bVar6;
        if (uVar8 >> bVar6 != 0) goto LAB_00135a07;
      }
      arith_encode(cinfo,(uchar *)(p_Var16 + -1),0);
      iVar10 = iVar10 + 1;
      piVar12 = piVar12 + 1;
      p_Var16 = p_Var16 + 3;
    } while( true );
  }
LAB_00135b3a:
  if (iVar15 <= cinfo->Se) {
    arith_encode(cinfo,(uchar *)((&pjVar3[9].finish_pass)[iVar2] + (iVar15 * 3 + -3)),1);
  }
  return 1;
LAB_00135a07:
  arith_encode(cinfo,(uchar *)(p_Var16 + -1),1);
  iVar15 = 0;
LAB_00135a42:
  arith_encode(cinfo,(uchar *)(pjVar3 + 0xf),iVar15);
  uVar8 = uVar13 - 1;
  if (uVar8 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 1;
    arith_encode(cinfo,(uchar *)p_Var16,1);
    if (uVar8 != 1) {
      arith_encode(cinfo,(uchar *)p_Var16,1);
      lVar11 = 0xbd;
      if ((int)(uint)cinfo->arith_ac_K[iVar2] < iVar10) {
        lVar11 = 0xd9;
      }
      p_Var16 = (&pjVar3[9].finish_pass)[iVar2] + lVar11;
      uVar7 = 2;
      uVar14 = uVar8;
      if (4 < uVar13) {
        do {
          arith_encode(cinfo,(uchar *)p_Var16,1);
          uVar7 = uVar7 * 2;
          p_Var16 = p_Var16 + 1;
          bVar5 = 7 < uVar14;
          uVar14 = uVar14 >> 1;
        } while (bVar5);
      }
    }
  }
  arith_encode(cinfo,(uchar *)p_Var16,0);
  if (1 < uVar7) {
    do {
      uVar7 = (int)uVar7 >> 1;
      arith_encode(cinfo,(uchar *)(p_Var16 + 0xe),(uint)((uVar7 & uVar8) != 0));
    } while (1 < uVar7);
  }
  iVar15 = iVar10 + 1;
  if ((int)lVar9 <= iVar10) goto code_r0x00135b34;
  goto LAB_0013597f;
code_r0x00135b34:
  iVar15 = iVar10 + 1;
  goto LAB_00135b3a;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_first(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  register int temp, temp2;
  register int nbits, r;
  int Sl = cinfo->Se - cinfo->Ss + 1;
  int Al = cinfo->Al;
  JCOEF values_unaligned[2 * DCTSIZE2 + 15];
  JCOEF *values;
  const JCOEF *cvalue;
  size_t zerobits;
  size_t bits[8 / SIZEOF_SIZE_T];

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart(entropy, entropy->next_restart_num);

#ifdef WITH_SIMD
  cvalue = values = (JCOEF *)PAD((JUINTPTR)values_unaligned, 16);
#else
  /* Not using SIMD, so alignment is not needed */
  cvalue = values = values_unaligned;
#endif

  /* Prepare data */
  entropy->AC_first_prepare(MCU_data[0][0], jpeg_natural_order + cinfo->Ss,
                            Sl, Al, values, bits);

  zerobits = bits[0];
#if SIZEOF_SIZE_T == 4
  zerobits |= bits[1];
#endif

  /* Emit any pending EOBRUN */
  if (zerobits && (entropy->EOBRUN > 0))
    emit_eobrun(entropy);

#if SIZEOF_SIZE_T == 4
  zerobits = bits[0];
#endif

  /* Encode the AC coefficients per section G.1.2.2, fig. G.3 */

  ENCODE_COEFS_AC_FIRST((void)0;);

#if SIZEOF_SIZE_T == 4
  zerobits = bits[1];
  if (zerobits) {
    int diff = ((values + DCTSIZE2 / 2) - cvalue);
    r = count_zeroes(&zerobits);
    r += diff;
    cvalue += r;
    goto first_iter_ac_first;
  }

  ENCODE_COEFS_AC_FIRST(first_iter_ac_first:);
#endif

  if (cvalue < (values + Sl)) { /* If there are trailing zeroes, */
    entropy->EOBRUN++;          /* count an EOB */
    if (entropy->EOBRUN == 0x7FFF)
      emit_eobrun(entropy);     /* force it out to avoid overflow */
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}